

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O3

void __thiscall
MIDIplay::noteUpdate
          (MIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  uint32_t *puVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  pointer pMVar5;
  pointer pAVar6;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar7;
  NoteHook p_Var8;
  undefined8 uVar9;
  bool bVar10;
  OPL3 *this_00;
  users_iterator uVar11;
  pl_basic_cell<MIDIplay::AdlChannel::LocationData> *ppVar12;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar13;
  byte bVar14;
  Phys *pPVar15;
  AdlChannel *this_01;
  long lVar16;
  double c;
  uint uVar17;
  ulong uVar18;
  OplTimbre *instrument;
  Phys *ph;
  double dVar19;
  double dVar20;
  Location my_loc;
  Location local_a4;
  ulong local_a0;
  int local_98;
  int local_94;
  long local_90;
  Phys *local_88;
  OPL3 *local_80;
  double local_78;
  OplInstMeta *local_70;
  size_t local_68;
  ulong local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  NoteInfo *local_38;
  
  local_80 = (this->m_synth).m_p;
  local_94 = (int)((i.cell_)->value).noteTone;
  local_40 = ((i.cell_)->value).currentTone;
  local_60 = (ulong)((i.cell_)->value).vol;
  local_98 = (int)((i.cell_)->value).midiins;
  local_70 = ((i.cell_)->value).ains;
  local_a4.note = ((i.cell_)->value).note;
  local_a4.MidCh = (uint16_t)midCh;
  if (((i.cell_)->value).isBlank == true) {
    if ((props_mask & 0x20) != 0) {
      pl_list<MIDIplay::MIDIchannel::NoteInfo>::deallocate
                (&(this->m_midiChannels).
                  super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                  _M_impl.super__Vector_impl_data._M_start[midCh].activenotes,i.cell_);
      return;
    }
  }
  else {
    uVar18 = (ulong)((i.cell_)->value).chip_channels_count;
    if (uVar18 != 0) {
      local_38 = &(i.cell_)->value;
      instrument = &((i.cell_)->value).chip_channels[0].op;
      local_68 = midCh;
      do {
        uVar3._0_1_ = instrument[-1].feedconn;
        uVar3._1_1_ = instrument[-1].noteOffset;
        if (((props_mask & 1) != 0) && (select_adlchn < 0 || (uint)uVar3 == select_adlchn)) {
          ::OPL3::setPatch(local_80,(ulong)uVar3,instrument);
          uVar11 = AdlChannel::find_or_create_user
                             ((this->m_chipChannels).
                              super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar3,&local_a4);
          if (((uVar11.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next !=
              (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
            ((uVar11.cell_)->value).sustained = 0;
            ((uVar11.cell_)->value).vibdelay_us = 0;
            uVar3 = local_70->soundKeyOnMs;
            ((uVar11.cell_)->value).fixed_sustain = (ulong)uVar3 == 40000;
            ((uVar11.cell_)->value).kon_time_until_neglible_us = (ulong)uVar3 * 1000;
            uVar9 = *(undefined8 *)((long)&instrument->carrier_E862 + 2);
            *(undefined8 *)&((uVar11.cell_)->value).ins = *(undefined8 *)&instrument[-1].feedconn;
            *(undefined8 *)((long)&((uVar11.cell_)->value).ins.op.carrier_E862 + 2) = uVar9;
          }
        }
        instrument = (OplTimbre *)&instrument[1].carrier_E862;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
      midCh = local_68;
      if (((i.cell_)->value).chip_channels_count != 0) {
        pPVar15 = ((i.cell_)->value).chip_channels;
        uVar17 = 0;
        lVar16 = local_68 * 0x140;
        local_90 = lVar16;
        local_88 = pPVar15;
        do {
          uVar3 = pPVar15[uVar17].chip_chan;
          c = (double)(ulong)uVar3;
          uVar18 = (ulong)((i.cell_)->value).chip_channels[1].chip_chan;
          if ((select_adlchn < 0) || ((uint)uVar3 == select_adlchn)) {
            ph = pPVar15 + uVar17;
            if ((props_mask & 0x20) == 0) {
              local_a0 = uVar18;
              if ((props_mask & 2) != 0) {
                ::OPL3::setPan(local_80,(size_t)c,
                               ((this->m_midiChannels).
                                super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                               [lVar16 + 0xffffffffffffffe9]);
                pPVar15 = local_88;
                lVar16 = local_90;
              }
              if ((props_mask & 4) != 0) {
                pMVar5 = (this->m_midiChannels).
                         super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                bVar14 = pMVar5->_padding2[lVar16 + 0xfffffffffffffffe];
                uVar18 = (ulong)((uint)bVar14 + (uint)bVar14);
                if (0x3f < bVar14) {
                  uVar18 = 0x7f;
                }
                if ((this->m_setup).fullRangeBrightnessCC74 != false) {
                  uVar18 = (ulong)bVar14;
                }
                ::OPL3::touchNote(local_80,(size_t)c,local_60,
                                  (ulong)pMVar5->noteAftertouch[lVar16 + 0xffffffffffffffe7],
                                  (ulong)pMVar5->noteAftertouch[local_90 + 0xffffffffffffffe8],
                                  uVar18,(bool)(local_68 == 9 |
                                               pMVar5->_padding2[lVar16 + 0xffffffffffffffff] & 1U))
                ;
                pPVar15 = local_88;
                lVar16 = local_90;
              }
              if ((props_mask & 8) != 0) {
                pAVar6 = (this->m_chipChannels).
                         super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar12 = &pAVar6[(long)c].users.endcell_;
                for (ppVar7 = pAVar6[(long)c].users.first_;
                    (ppVar13 = (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12,
                    ppVar7 != (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12 &&
                    ((*(uint16_t *)&ppVar7->value != local_a4.MidCh ||
                     (ppVar13 = ppVar7, *(undefined1 *)((long)&ppVar7->value + 2) != local_a4.note))
                    )); ppVar7 = *(pl_cell<MIDIplay::AdlChannel::LocationData> **)
                                  ((long)&ppVar7->
                                          super_pl_basic_cell<MIDIplay::AdlChannel::LocationData> +
                                  8)) {
                }
                if (((ppVar13->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                     (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) ||
                   (*(int *)((bool *)((long)ppVar13 + 0x10) + 4) == 0)) {
                  pMVar5 = (this->m_midiChannels).
                           super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  bVar14 = pMVar5->noteAftertouch[lVar16 + 0xffffffffffffffeb];
                  if (pMVar5->noteAftertouch[lVar16 + 0xffffffffffffffeb] <
                      pMVar5->noteAftertouch[lVar16 + 0xffffffffffffffea]) {
                    bVar14 = pMVar5->noteAftertouch[lVar16 + 0xffffffffffffffea];
                  }
                  bVar2 = ((i.cell_)->value).vibrato;
                  if (bVar14 <= bVar2) {
                    bVar14 = bVar2;
                  }
                  dVar19 = 0.0;
                  if (((local_70->flags & 1) != 0) && (ph->pseudo4op == true)) {
                    dVar19 = local_70->voice2_fine_tune;
                  }
                  local_78 = (double)*(int *)(pMVar5->_padding + lVar16 + 7) *
                             *(double *)(pMVar5->_padding + lVar16 + 0xf);
                  dVar20 = (double)(int)(ph->op).noteOffset + local_78;
                  if ((bVar14 != 0) &&
                     (((ppVar13->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                       (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0 ||
                      (*(long *)(pMVar5->_padding2 + lVar16 + 0xfffffffffffffff3) <=
                       *(long *)((long)((long)ppVar13 + 0x30) + 8))))) {
                    local_58 = (double)bVar14 *
                               *(double *)(pMVar5->_padding2 + lVar16 + 0xffffffffffffffeb);
                    local_50 = dVar20;
                    local_48 = dVar19;
                    dVar19 = sin(*(double *)(pMVar5->_padding + lVar16 + 0x1f));
                    dVar20 = local_50 + dVar19 * local_58;
                    dVar19 = local_48;
                  }
                  ::OPL3::noteOn(local_80,(size_t)c,local_a0,dVar19 + dVar20 + local_40);
                  p_Var8 = (this->hooks).onNote;
                  pPVar15 = local_88;
                  lVar16 = local_90;
                  if (p_Var8 != (NoteHook)0x0) {
                    (*p_Var8)((this->hooks).onNote_userData,(uint)uVar3,local_94,local_98,
                              (int)local_60,local_78);
                    pPVar15 = local_88;
                    lVar16 = local_90;
                  }
                }
              }
            }
            else {
              this_01 = (this->m_chipChannels).
                        super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)c;
              if (((this->m_midiChannels).
                   super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                   ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                  [lVar16 + 0xffffffffffffffee] == '\0') {
                ppVar12 = &(this_01->users).endcell_;
                ppVar7 = (this_01->users).first_;
                while ((ppVar13 = (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12,
                       ppVar7 != (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12 &&
                       (((ppVar7->value).loc.MidCh != local_a4.MidCh ||
                        (ppVar13 = ppVar7, (ppVar7->value).loc.note != local_a4.note))))) {
                  ppVar7 = (ppVar7->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next;
                }
                local_a0 = (long)c * 0x58;
                local_78 = c;
                if (((ppVar13->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                     (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) ||
                   (((ppVar13->value).sustained & 2) != 0)) {
                  bVar10 = false;
                }
                else {
                  pl_list<MIDIplay::AdlChannel::LocationData>::deallocate(&this_01->users,ppVar13);
                  bVar10 = true;
                }
                p_Var8 = (this->hooks).onNote;
                if (p_Var8 != (NoteHook)0x0) {
                  (*p_Var8)((this->hooks).onNote_userData,(uint)uVar3,local_94,local_98,0,0.0);
                }
                this_00 = local_80;
                if ((bVar10) &&
                   (*(long *)((long)&(((this->m_chipChannels).
                                       super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->users).size_ +
                             local_a0) == 0)) {
                  ::OPL3::noteOff(local_80,(size_t)local_78);
                  if ((props_mask & 0x40) == 0) {
                    *(ulong *)((long)&((this->m_chipChannels).
                                       super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                      koff_time_until_neglible_us + local_a0) =
                         (ulong)local_70->soundKeyOffMs * 1000;
                  }
                  else {
                    ::OPL3::touchNote(this_00,(size_t)local_78,0,0,0,0x7f,false);
                    *(undefined8 *)
                     ((long)&((this->m_chipChannels).
                              super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             koff_time_until_neglible_us + local_a0) = 0;
                  }
                }
              }
              else {
                uVar11 = AdlChannel::find_or_create_user(this_01,&local_a4);
                if (((uVar11.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next
                    != (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
                  puVar1 = &((uVar11.cell_)->value).sustained;
                  *(byte *)puVar1 = (byte)*puVar1 | 1;
                }
                p_Var8 = (this->hooks).onNote;
                if (p_Var8 != (NoteHook)0x0) {
                  (*p_Var8)((this->hooks).onNote_userData,(uint)uVar3,local_94,local_98,-1,0.0);
                }
              }
              MIDIchannel::NoteInfo::phys_erase_at(local_38,ph);
              uVar17 = uVar17 - 1;
              pPVar15 = local_88;
              lVar16 = local_90;
            }
          }
          uVar17 = uVar17 + 1;
          uVar4 = ((i.cell_)->value).chip_channels_count;
        } while (uVar17 < uVar4);
        midCh = local_68;
        if (uVar4 != 0) {
          return;
        }
      }
    }
    pMVar5 = (this->m_midiChannels).
             super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((i.cell_)->value).glideRate < INFINITY) {
      pMVar5[midCh].gliding_note_count = pMVar5[midCh].gliding_note_count - 1;
    }
    if (0.0 < ((i.cell_)->value).ttl) {
      pMVar5[midCh].extended_note_count = pMVar5[midCh].extended_note_count - 1;
    }
    pl_list<MIDIplay::MIDIchannel::NoteInfo>::deallocate(&pMVar5[midCh].activenotes,i.cell_);
  }
  return;
}

Assistant:

void MIDIplay::noteUpdate(size_t midCh,
                          MIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const int midiins     = static_cast<int>(info.midiins);
    const OplInstMeta &ains = *info.ains;
    AdlChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.op);
            AdlChannel::users_iterator i = m_chipChannels[c].find_or_create_user(my_loc);
            if(!i.is_end())    // inserts if necessary
            {
                AdlChannel::LocationData &d = i->value;
                d.sustained = AdlChannel::LocationData::Sustain_None;
                d.vibdelay_us = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(OPLNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c          = ins.chip_chan;
        uint16_t c_secondary    = info.chip_channels[1].chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(!m_midiChannels[midCh].sustain)
            {
                AdlChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & AdlChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0, 0, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                AdlChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= AdlChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            brightness,
                            is_percussion);

            /* DEBUG ONLY!!!
            static uint32_t max = 0;

            if(volume == 0)
                max = 0;

            if(volume > max)
                max = volume;

            printf("%d\n", max);
            fflush(stdout);
            */
        }

        if(props_mask & Upd_Pitch)
        {
            AdlChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == AdlChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.op.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OplInstMeta::Flag_Pseudo4op) && ins.pseudo4op)
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, c_secondary, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}